

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

void __thiscall
sysapi::epoll_registration::epoll_registration(epoll_registration *this,epoll_registration *rhs)

{
  function<void_(unsigned_int)> local_48;
  epoll_registration *local_18;
  epoll_registration *rhs_local;
  epoll_registration *this_local;
  
  this->ep = rhs->ep;
  this->fd = rhs->fd;
  this->events = rhs->events;
  local_18 = rhs;
  rhs_local = this;
  std::function<void_(unsigned_int)>::function(&this->callback,&rhs->callback);
  update(this);
  local_18->ep = (epoll *)0x0;
  local_18->fd = -1;
  local_18->events = 0;
  std::function<void_(unsigned_int)>::function(&local_48);
  std::function<void_(unsigned_int)>::operator=(&local_18->callback,&local_48);
  std::function<void_(unsigned_int)>::~function(&local_48);
  return;
}

Assistant:

epoll_registration::epoll_registration(epoll_registration&& rhs)
    : ep(rhs.ep)
    , fd(rhs.fd)
    , events(rhs.events)
    , callback(std::move(rhs.callback))
{
    update();
    rhs.ep = nullptr;
    rhs.fd = -1;
    rhs.events = 0;
    rhs.callback = callback_t();
}